

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

long mi_option_get(mi_option_t option)

{
  uint in_EDI;
  mi_option_desc_t *desc;
  mi_option_desc_t *in_stack_000000d0;
  long local_8;
  
  if (in_EDI < 0x25) {
    if (options[in_EDI].init == UNINIT) {
      mi_option_init(in_stack_000000d0);
    }
    local_8 = options[in_EDI].value;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

mi_decl_nodiscard long mi_option_get(mi_option_t option) {
  mi_assert(option >= 0 && option < _mi_option_last);
  if (option < 0 || option >= _mi_option_last) return 0;
  mi_option_desc_t* desc = &options[option];
  mi_assert(desc->option == option);  // index should match the option
  if mi_unlikely(desc->init == UNINIT) {
    mi_option_init(desc);
  }